

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_enc.c
# Opt level: O0

int PutWebPHeaders(VP8Encoder *enc,size_t size0,size_t vp8_size,size_t riff_size)

{
  int iVar1;
  int iVar2;
  VP8Encoder *in_RCX;
  size_t in_RDX;
  VP8Encoder *in_RSI;
  VP8Encoder *in_RDI;
  WebPEncodingError err;
  WebPPicture *pic;
  WebPEncodingError local_34;
  WebPPicture *pic_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pic_00 = in_RDI->pic;
  local_34 = PutRIFFHeader(in_RSI,in_RDX);
  iVar2 = (int)(in_RDX >> 0x20);
  if ((((local_34 == VP8_ENC_OK) &&
       ((iVar1 = IsVP8XNeeded(in_RDI), iVar1 == 0 ||
        (local_34 = PutVP8XHeader((VP8Encoder *)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)),
        local_34 == VP8_ENC_OK)))) &&
      ((in_RDI->has_alpha == 0 || (local_34 = PutAlphaChunk(in_RCX), local_34 == VP8_ENC_OK)))) &&
     ((local_34 = PutVP8Header((WebPPicture *)in_RCX,(size_t)pic_00), local_34 == VP8_ENC_OK &&
      (local_34 = PutVP8FrameHeader((WebPPicture *)in_RSI,iVar2,(size_t)in_RCX),
      local_34 == VP8_ENC_OK)))) {
    iVar2 = 1;
  }
  else {
    iVar2 = WebPEncodingSetError(pic_00,local_34);
  }
  return iVar2;
}

Assistant:

static int PutWebPHeaders(const VP8Encoder* const enc, size_t size0,
                          size_t vp8_size, size_t riff_size) {
  WebPPicture* const pic = enc->pic;
  WebPEncodingError err = VP8_ENC_OK;

  // RIFF header.
  err = PutRIFFHeader(enc, riff_size);
  if (err != VP8_ENC_OK) goto Error;

  // VP8X.
  if (IsVP8XNeeded(enc)) {
    err = PutVP8XHeader(enc);
    if (err != VP8_ENC_OK) goto Error;
  }

  // Alpha.
  if (enc->has_alpha) {
    err = PutAlphaChunk(enc);
    if (err != VP8_ENC_OK) goto Error;
  }

  // VP8 header.
  err = PutVP8Header(pic, vp8_size);
  if (err != VP8_ENC_OK) goto Error;

  // VP8 frame header.
  err = PutVP8FrameHeader(pic, enc->profile, size0);
  if (err != VP8_ENC_OK) goto Error;

  // All OK.
  return 1;

  // Error.
 Error:
  return WebPEncodingSetError(pic, err);
}